

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::f64_Convert_i64s(w3Interp *this)

{
  int64_t *piVar1;
  w3Interp *this_local;
  
  piVar1 = w3Stack::i64(&this->super_w3Stack);
  w3Stack::set_f64(&this->super_w3Stack,(double)*piVar1);
  return;
}

Assistant:

INTERP (f64_Convert_i64s)
{
    set_f64 ((double)i64 ());
}